

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::sampleTextureBorder<float>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar1;
  Vector<float,_4> VVar2;
  tcu local_54 [16];
  tcu local_44 [16];
  tcu local_34 [16];
  TextureChannelClass local_24;
  Sampler *pSStack_20;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  pSStack_20 = sampler;
  sampler_local = (Sampler *)format;
  format_local = (TextureFormat *)this;
  local_24 = getTextureChannelClass(format->type);
  switch(local_24) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(local_34,(TextureFormat *)sampler_local,pSStack_20);
    VVar1 = Vector<float,_4>::cast<float>((Vector<float,_4> *)this);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(local_44,(TextureFormat *)sampler_local,pSStack_20);
    VVar1 = Vector<int,_4>::cast<float>((Vector<int,_4> *)this);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(local_54,(TextureFormat *)sampler_local,pSStack_20);
    VVar1 = Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this);
    VVar1.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar1.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar1.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar1.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar2.m_data[0] = VVar1.m_data[0];
  auVar3._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vector<float,_4>)VVar2.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}